

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CovergroupType::serializeTo(CovergroupType *this,ASTSerializer *serializer)

{
  TimingControl *__n;
  Type *value;
  string_view name;
  
  __n = getCoverageEvent(this);
  if (__n != (TimingControl *)0x0) {
    ASTSerializer::write(serializer,5,"event",(size_t)__n);
  }
  value = getBaseGroup(this);
  if (value != (Type *)0x0) {
    name._M_str = "baseGroup";
    name._M_len = 9;
    ASTSerializer::writeLink(serializer,name,&value->super_Symbol);
    return;
  }
  return;
}

Assistant:

void CovergroupType::serializeTo(ASTSerializer& serializer) const {
    if (auto ev = getCoverageEvent())
        serializer.write("event", *ev);
    if (auto bg = getBaseGroup())
        serializer.writeLink("baseGroup", *bg);
}